

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeTypes(WasmBinaryWriter *this)

{
  ulong *puVar1;
  uint uVar2;
  pointer pHVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  BufferWithRandomAccess *pBVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Storage<wasm::HeapType,_true> _Var7;
  bool bVar8;
  int32_t start;
  Shareability SVar9;
  HeapTypeKind HVar10;
  RecGroup RVar11;
  mapped_type *pmVar12;
  pointer pHVar13;
  size_t sVar14;
  uint *puVar15;
  Type *pTVar16;
  Struct *__x;
  HeapType type_00;
  uint *__n;
  allocator_type *__a;
  void *__buf;
  allocator_type *paVar17;
  void *__buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  RecGroup unaff_R12;
  int iVar18;
  byte bVar19;
  Type *__range5;
  Type *this_01;
  _Storage<wasm::HeapType,_true> field;
  iterator __begin2;
  long lVar20;
  optional<wasm::HeapType> oVar21;
  undefined1 local_a8 [8];
  HeapType type;
  _Bit_pointer local_88;
  HeapType local_70;
  value_type type_2;
  RecGroup currGroup;
  undefined4 local_58;
  undefined4 uStack_54;
  HeapType type_1;
  undefined1 local_48 [4];
  undefined1 auStack_44 [4];
  optional<wasm::HeapType> super;
  
  pHVar13 = (this->indexedTypes).types.
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  currGroup.id = (uintptr_t)
                 (this->indexedTypes).types.
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  if ((pointer)currGroup.id != pHVar13) {
    bVar19 = 1;
    iVar18 = 0;
    do {
      local_a8 = (undefined1  [8])pHVar13->id;
      RVar11 = HeapType::getRecGroup((HeapType *)local_a8);
      iVar18 = iVar18 + (uint)(unaff_R12.id != RVar11.id | bVar19);
      pHVar13 = pHVar13 + 1;
      bVar19 = 0;
      unaff_R12 = RVar11;
    } while (pHVar13 != (pointer)currGroup.id);
    auVar5[0xf] = 0;
    auVar5._0_15_ = stack0xffffffffffffffb9;
    _local_48 = (Field)(auVar5 << 8);
    __a = (allocator_type *)&stack0xffffffffffffffa8;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_a8,
               (long)(this->indexedTypes).types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->indexedTypes).types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,(bool *)local_48,__a);
    pHVar13 = (this->indexedTypes).types.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar3 = (this->indexedTypes).types.
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pHVar13 != pHVar3) {
      do {
        _local_58 = pHVar13->id;
        oVar21 = HeapType::getDeclaredSuperType((HeapType *)&stack0xffffffffffffffa8);
        _local_48 = oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._0_9_;
        if (((undefined1  [16])
             oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          pmVar12 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->indexedTypes).indices,(key_type *)local_48);
          uVar2 = *pmVar12;
          __a = (allocator_type *)(ulong)uVar2;
          puVar1 = (ulong *)((long)local_a8 + (ulong)(uVar2 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
        }
        pHVar13 = pHVar13 + 1;
      } while (pHVar13 != pHVar3);
    }
    start = startSection<wasm::BinaryConsts::Section>(this,Type);
    local_48 = (undefined1  [4])iVar18;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)local_48,(int)this->o,__buf,(size_t)__a);
    pHVar13 = (this->indexedTypes).types.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->indexedTypes).types.
        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_finish != pHVar13) {
      paVar17 = (allocator_type *)0x0;
      bVar19 = 0;
      do {
        local_70.id = pHVar13[(long)paVar17].id;
        type_2.id = (uintptr_t)HeapType::getRecGroup(&local_70);
        if ((!(bool)(bVar19 & currGroup.id == type_2.id)) &&
           (sVar14 = RecGroup::size((RecGroup *)&type_2), 1 < sVar14)) {
          this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          local_48[0] = 0x4e;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this_00,local_48);
          sVar14 = RecGroup::size((RecGroup *)&type_2);
          local_48 = (undefined1  [4])(int)sVar14;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)local_48,(int)this_00,__buf_00,(size_t)__a)
          ;
        }
        currGroup.id = type_2.id;
        oVar21 = HeapType::getDeclaredSuperType(&local_70);
        if ((((undefined1  [16])
              oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) || (bVar8 = HeapType::isOpen(&local_70), bVar8)) {
          bVar8 = HeapType::isOpen(&local_70);
          if (bVar8) {
            local_48[0] = 0x50;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                       local_48);
            __buf_01 = extraout_RDX;
          }
          else {
            local_48[0] = 0x4f;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                       local_48);
            __buf_01 = extraout_RDX_00;
          }
          iVar18 = (int)this->o;
          if (((undefined1  [16])
               oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            auVar6._12_4_ = 0;
            auVar6._0_12_ = _auStack_44;
            _local_48 = (Field)(auVar6 << 0x20);
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)local_48,iVar18,__buf_01,(size_t)__a);
          }
          else {
            local_48 = (undefined1  [4])0x1;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)local_48,iVar18,__buf_01,(size_t)__a);
            writeHeapType(this,oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,
                          Inexact);
          }
        }
        SVar9 = HeapType::getShared(&local_70);
        if (SVar9 == Shared) {
          local_48[0] = 0x65;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_48)
          ;
        }
        oVar21 = HeapType::getDescribedType(&local_70);
        if (((undefined1  [16])
             oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          local_48[0] = 0x4c;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_48)
          ;
          writeHeapType(this,oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,
                        Inexact);
        }
        oVar21 = HeapType::getDescriptorType(&local_70);
        if (((undefined1  [16])
             oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          local_48[0] = 0x4d;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_48)
          ;
          writeHeapType(this,oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,
                        Inexact);
        }
        HVar10 = HeapType::getKind(&local_70);
        __n = &switchD_00c5fe59::switchdataD_00e2f488;
        switch(HVar10) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                             ,0x148);
        case Func:
          local_48[0] = 0x60;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_48)
          ;
          _local_48 = (Field)HeapType::getSignature(&local_70);
          lVar20 = 0;
          do {
            this_01 = (Type *)(local_48 + lVar20);
            pBVar4 = this->o;
            sVar14 = wasm::Type::size(this_01);
            local_58 = (int)sVar14;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)&stack0xffffffffffffffa8,(int)pBVar4,
                       __buf_02,(size_t)__n);
            type_1.id = 0;
            _local_58 = (uintptr_t)this_01;
            puVar15 = (uint *)wasm::Type::size(this_01);
            while (((uint *)type_1.id != puVar15 || ((Type *)_local_58 != this_01))) {
              pTVar16 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffa8);
              writeType(this,(Type)pTVar16->id);
              __n = (uint *)(type_1.id + 1);
              type_1.id = (uintptr_t)__n;
            }
            lVar20 = lVar20 + 8;
          } while (lVar20 != 0x10);
          break;
        case Struct:
          local_48[0] = 0x5f;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_48)
          ;
          __x = HeapType::getStruct(&local_70);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,&__x->fields);
          local_58 = (int)((ulong)((long)super.super__Optional_base<wasm::HeapType,_true,_true>.
                                         _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                         _M_payload - (long)_local_48) >> 4);
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&stack0xffffffffffffffa8,(int)this->o,
                     __buf_03,(size_t)__n);
          _Var7 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload;
          field = _local_48;
          if (_local_48 !=
              super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload) {
            do {
              writeField(this,(Field *)field);
              field = (_Storage<wasm::HeapType,_true>)((long)field + 0x10);
            } while (field != _Var7);
          }
          if (_local_48 != (_Storage<wasm::HeapType,_true>)0x0) {
            operator_delete((void *)_local_48,
                            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._8_8_ - (long)_local_48);
          }
          break;
        case Array:
          local_48[0] = 0x5e;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_48)
          ;
          HeapType::getArray((HeapType *)local_48);
          writeField(this,(Field *)local_48);
          break;
        case Cont:
          local_48[0] = 0x5d;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_48)
          ;
          type_00.id = (uintptr_t)HeapType::getContinuation(&local_70);
          writeHeapType(this,type_00,Inexact);
        }
        paVar17 = (allocator_type *)(ulong)((int)paVar17 + 1);
        pHVar13 = (this->indexedTypes).types.
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __a = (allocator_type *)
              ((long)(this->indexedTypes).types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pHVar13 >> 3);
        bVar19 = 1;
      } while (paVar17 < __a);
    }
    finishSection(this,start);
    if (local_a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_a8,(long)local_88 - (long)local_a8);
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeTypes() {
  if (indexedTypes.types.size() == 0) {
    return;
  }
  // Count the number of recursion groups, which is the number of elements in
  // the type section.
  size_t numGroups = 0;
  {
    std::optional<RecGroup> lastGroup;
    for (auto type : indexedTypes.types) {
      auto currGroup = type.getRecGroup();
      numGroups += lastGroup != currGroup;
      lastGroup = currGroup;
    }
  }

  // As a temporary measure, detect which types have subtypes and always use
  // `sub` or `sub final` for these types. The standard says that types without
  // `sub` or `sub final` are final, but we currently treat them as non-final.
  // To avoid unsafe ambiguity, only use the short form for types that it would
  // be safe to treat as final, i.e. types without subtypes.
  std::vector<bool> hasSubtypes(indexedTypes.types.size());
  for (auto type : indexedTypes.types) {
    if (auto super = type.getDeclaredSuperType()) {
      hasSubtypes[indexedTypes.indices[*super]] = true;
    }
  }

  auto start = startSection(BinaryConsts::Section::Type);
  o << U32LEB(numGroups);
  std::optional<RecGroup> lastGroup = std::nullopt;
  for (Index i = 0; i < indexedTypes.types.size(); ++i) {
    auto type = indexedTypes.types[i];
    // Check whether we need to start a new recursion group. Recursion groups of
    // size 1 are implicit, so only emit a group header for larger groups.
    auto currGroup = type.getRecGroup();
    if (lastGroup != currGroup && currGroup.size() > 1) {
      o << uint8_t(BinaryConsts::EncodedType::Rec) << U32LEB(currGroup.size());
    }
    lastGroup = currGroup;
    // Emit the type definition.
    auto super = type.getDeclaredSuperType();
    if (super || type.isOpen()) {
      if (type.isOpen()) {
        o << uint8_t(BinaryConsts::EncodedType::Sub);
      } else {
        o << uint8_t(BinaryConsts::EncodedType::SubFinal);
      }
      if (super) {
        o << U32LEB(1);
        writeHeapType(*super, Inexact);
      } else {
        o << U32LEB(0);
      }
    }
    if (type.isShared()) {
      o << uint8_t(BinaryConsts::EncodedType::Shared);
    }
    if (auto desc = type.getDescribedType()) {
      o << uint8_t(BinaryConsts::EncodedType::Describes);
      writeHeapType(*desc, Inexact);
    }
    if (auto desc = type.getDescriptorType()) {
      o << uint8_t(BinaryConsts::EncodedType::Descriptor);
      writeHeapType(*desc, Inexact);
    }
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        o << uint8_t(BinaryConsts::EncodedType::Func);
        auto sig = type.getSignature();
        for (auto& sigType : {sig.params, sig.results}) {
          o << U32LEB(sigType.size());
          for (const auto& type : sigType) {
            writeType(type);
          }
        }
        break;
      }
      case HeapTypeKind::Struct: {
        o << uint8_t(BinaryConsts::EncodedType::Struct);
        auto fields = type.getStruct().fields;
        o << U32LEB(fields.size());
        for (const auto& field : fields) {
          writeField(field);
        }
        break;
      }
      case HeapTypeKind::Array:
        o << uint8_t(BinaryConsts::EncodedType::Array);
        writeField(type.getArray().element);
        break;
      case HeapTypeKind::Cont:
        o << uint8_t(BinaryConsts::EncodedType::Cont);
        writeHeapType(type.getContinuation().type, Inexact);
        break;
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
  }
  finishSection(start);
}